

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O1

void __thiscall Fl_Pixmap::desaturate(Fl_Pixmap *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  char cVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  uchar b;
  uchar r;
  int ncolors;
  int chars_per_pixel;
  char line [255];
  byte local_143;
  byte local_142;
  byte local_141;
  int local_140;
  int local_13c;
  char local_138 [264];
  
  (*(this->super_Fl_Image)._vptr_Fl_Image[8])();
  copy_data(this);
  __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&local_140);
  if (local_140 < 0) {
    pcVar5 = (this->super_Fl_Image).data_[1];
    lVar8 = 0;
    do {
      cVar7 = (char)(((uint)(byte)pcVar5[lVar8 * 4 + 2] * 0x3d +
                      (uint)(byte)pcVar5[lVar8 * 4 + 1] * 0x1f +
                     (uint)(byte)pcVar5[lVar8 * 4 + 3] * 8) * 0x147b >> 0x13);
      pcVar5[lVar8 * 4 + 3] = cVar7;
      pcVar5[lVar8 * 4 + 2] = cVar7;
      pcVar5[lVar8 * 4 + 1] = cVar7;
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 < -local_140);
  }
  else if (0 < local_140) {
    lVar8 = 0;
    do {
      lVar1 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      pcVar9 = (this->super_Fl_Image).data_[lVar1] + (long)local_13c + 1;
      pcVar5 = pcVar9;
      do {
        cVar7 = *pcVar9;
        if (cVar7 == '\0') {
          bVar11 = false;
        }
        else {
          do {
            iVar2 = isspace((int)cVar7);
            if (iVar2 == 0) break;
            cVar7 = pcVar9[1];
            pcVar9 = pcVar9 + 1;
          } while (cVar7 != '\0');
          bVar11 = cVar7 == 'c';
        }
        do {
          pcVar10 = pcVar9 + 1;
          if (*pcVar10 == '\0') break;
          iVar2 = isspace((int)*pcVar10);
          pcVar9 = pcVar10;
        } while (iVar2 == 0);
        cVar7 = *pcVar10;
        bVar12 = cVar7 == '\0';
        if (bVar12) {
LAB_001c40ca:
          bVar11 = false;
          pcVar10 = pcVar5;
          pcVar9 = pcVar5;
        }
        else {
          while (iVar2 = isspace((int)cVar7), iVar2 != 0) {
            cVar7 = pcVar10[1];
            bVar12 = cVar7 == '\0';
            if (bVar12) goto LAB_001c40ca;
            pcVar10 = pcVar10 + 1;
          }
          pcVar9 = pcVar10;
          if (bVar12) {
            pcVar9 = pcVar5;
          }
          if (bVar11 || bVar12) {
            bVar11 = false;
            pcVar10 = pcVar5;
          }
          else {
            cVar7 = *pcVar10;
            bVar11 = true;
            pcVar9 = pcVar10;
            while ((cVar7 != '\0' && (iVar2 = isspace((int)cVar7), iVar2 == 0))) {
              cVar7 = pcVar9[1];
              pcVar9 = pcVar9 + 1;
            }
          }
        }
        pcVar5 = pcVar10;
      } while (bVar11);
      iVar2 = fl_parse_color(pcVar9,&local_141,&local_143,&local_142);
      if (iVar2 != 0) {
        uVar3 = ((uint)local_143 * 0x3d + (uint)local_141 * 0x1f + (uint)local_142 * 8) * 0x147b >>
                0x13;
        local_143 = (byte)uVar3;
        pcVar5 = (this->super_Fl_Image).data_[lVar8];
        if (local_13c < 2) {
          uVar6 = uVar3 & 0xff;
          pcVar9 = "%c c #%02X%02X%02X";
        }
        else {
          uVar6 = (uint)pcVar5[1];
          pcVar9 = "%c%c c #%02X%02X%02X";
        }
        sprintf(local_138,pcVar9,(ulong)(uint)(int)*pcVar5,(ulong)uVar6,(ulong)(uVar3 & 0xff),
                (ulong)(uVar3 & 0xff));
        pcVar5 = (this->super_Fl_Image).data_[lVar8];
        if (pcVar5 != (char *)0x0) {
          operator_delete__(pcVar5);
        }
        sVar4 = strlen(local_138);
        pcVar5 = (char *)operator_new__(sVar4 + 1);
        (this->super_Fl_Image).data_[lVar8] = pcVar5;
        strcpy((this->super_Fl_Image).data_[lVar8],local_138);
      }
    } while (lVar8 < local_140);
  }
  return;
}

Assistant:

void Fl_Pixmap::desaturate() {
  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  copy_data();

  // Update the colormap to grayscale...
  char		line[255];	// New colormap line
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel;// Characters per color
  uchar		r, g, b;

  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);

  if (ncolors < 0) {
    // Update FLTK colormap...
    ncolors = -ncolors;
    uchar *cmap = (uchar *)(data()[1]);
    for (i = 0; i < ncolors; i ++, cmap += 4) {
      g = (uchar)((cmap[1] * 31 + cmap[2] * 61 + cmap[3] * 8) / 100);
      cmap[1] = cmap[2] = cmap[3] = g;
    }
  } else {
    // Update standard XPM colormap...
    for (i = 0; i < ncolors; i ++) {
      // look for "c word", or last word if none:
      const char *p = data()[i + 1] + chars_per_pixel + 1;
      const char *previous_word = p;
      for (;;) {
	while (*p && isspace(*p)) p++;
	char what = *p++;
	while (*p && !isspace(*p)) p++;
	while (*p && isspace(*p)) p++;
	if (!*p) {p = previous_word; break;}
	if (what == 'c') break;
	previous_word = p;
	while (*p && !isspace(*p)) p++;
      }

      if (fl_parse_color(p, r, g, b)) {
        g = (uchar)((r * 31 + g * 61 + b * 8) / 100);

        if (chars_per_pixel > 1) sprintf(line, "%c%c c #%02X%02X%02X", data()[i + 1][0],
	                                 data()[i + 1][1], g, g, g);
        else sprintf(line, "%c c #%02X%02X%02X", data()[i + 1][0], g, g, g);

        delete[] (char *)data()[i + 1];
	((char **)data())[i + 1] = new char[strlen(line) + 1];
	strcpy((char *)data()[i + 1], line);
      }
    }
  }
}